

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

FileEntryInfo * __thiscall FileEntryInfo::fileByName(FileEntryInfo *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference ppFVar3;
  FileEntryInfo **i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1;
  string *name_local;
  FileEntryInfo *this_local;
  
  __end1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(&this->m_files);
  i = (FileEntryInfo **)
      std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&this->m_files);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                                *)&i);
    if (!bVar1) {
      return (FileEntryInfo *)0x0;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1);
    _Var2 = std::operator==(&(*ppFVar3)->m_name,name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1);
  }
  return *ppFVar3;
}

Assistant:

FileEntryInfo *FileEntryInfo::fileByName(const std::string &name) const
{
    for (auto &i : m_files)
    {
        if (i->m_name == name)
            return i;
    }
    return nullptr;
}